

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedNames.cpp
# Opt level: O0

void __thiscall wasm::RemoveUnusedNames::handleBreakTarget(RemoveUnusedNames *this,Name *name)

{
  bool bVar1;
  Name local_38;
  _Self local_28;
  _Self local_20;
  key_type *local_18;
  Name *name_local;
  RemoveUnusedNames *this_local;
  
  local_18 = name;
  name_local = (Name *)this;
  bVar1 = IString::is(&name->super_IString);
  if (bVar1) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
         ::find(&this->branchesSeen,local_18);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
         ::end(&this->branchesSeen);
    bVar1 = std::operator==(&local_20,&local_28);
    if (bVar1) {
      wasm::Name::Name(&local_38);
      wasm::Name::operator=(local_18,&local_38);
    }
    else {
      std::
      map<wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
      ::erase(&this->branchesSeen,local_18);
    }
  }
  return;
}

Assistant:

void handleBreakTarget(Name& name) {
    if (name.is()) {
      if (branchesSeen.find(name) == branchesSeen.end()) {
        name = Name();
      } else {
        branchesSeen.erase(name);
      }
    }
  }